

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prsxbin(prscxdef *ctx,prsbdef *binctx)

{
  int iVar1;
  undefined8 *in_RSI;
  prscxdef *in_RDI;
  bool bVar2;
  int *lp;
  int t;
  prsndef *n;
  tokcxdef *in_stack_00000078;
  prscxdef *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd6;
  undefined1 uVar3;
  int *local_28;
  int local_1c;
  prsndef *local_18;
  
  local_18 = (prsndef *)(*(code *)in_RSI[1])(in_RDI,in_RSI[3]);
  do {
    local_1c = (in_RDI->prscxtok->tokcxcur).toktyp;
    local_28 = (int *)*in_RSI;
    while( true ) {
      uVar3 = false;
      if (*local_28 != 0) {
        uVar3 = *local_28 != local_1c;
      }
      if ((bool)uVar3 == false) break;
      local_28 = local_28 + 1;
    }
    if (*local_28 != local_1c) {
      return local_18;
    }
    if ((in_RDI->prscxflg & 4) != 0) {
      local_28 = prsxbin::ambig_ops;
      while( true ) {
        bVar2 = false;
        if (*local_28 != 0) {
          bVar2 = *local_28 != local_1c;
        }
        if (!bVar2) break;
        local_28 = local_28 + 1;
      }
      if (*local_28 != 0) {
        in_RDI->prscxerr->errcxptr->erraav[0] =
             *(erradef *)(prsxbin::ambig_names + ((long)(local_28 + -0x5bce8) >> 2));
        in_RDI->prscxerr->errcxptr->erraac = 1;
        errlogn((errcxdef *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(char *)0x12d75f);
        return local_18;
      }
      in_stack_ffffffffffffffd6 = 0;
    }
    toknext(in_stack_00000078);
    iVar1 = prs_cmode(in_RDI);
    if (iVar1 != 0) {
      in_stack_ffffffffffffffd0 = local_1c;
      if (local_1c == 7) {
        local_1c = 0x9e;
      }
      else if (local_1c == 0xd0) {
        local_1c = 7;
      }
    }
    in_stack_ffffffffffffffb8 = in_RDI;
    (*(code *)in_RSI[2])(in_RDI,in_RSI[3]);
    local_18 = prsnew2((prscxdef *)
                       CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffffd6,
                                               CONCAT24(in_stack_ffffffffffffffd4,
                                                        in_stack_ffffffffffffffd0))),
                       (int)((ulong)local_18 >> 0x20),
                       (prsndef *)CONCAT44(local_1c,in_stack_ffffffffffffffc0),
                       (prsndef *)in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffc4 = local_1c;
  } while (*(int *)(in_RSI + 4) != 0);
  return local_18;
}

Assistant:

static prsndef *prsxbin(prscxdef *ctx, prsbdef *binctx)
{
    prsndef *n;
    int      t;
    int     *lp;
    
    n = (*binctx->prsblf)(ctx, binctx->prsbctx);
    do
    {
        t = ctx->prscxtok->tokcxcur.toktyp;
        for (lp = binctx->prsblst ; *lp && *lp != t ; ++lp) ;
        if (*lp == t)
        {
            /*
             *   if inside a list, check to see if this is a binary
             *   operator that can also server as a unary operator -- if
             *   so, interpret it as a unary operator and warn about it 
             */
            if (ctx->prscxflg & PRSCXFLST)
            {
                static int ambig_ops[] = { TOKTBAND, TOKTPLUS, TOKTMINUS, 0 };
                static char *ambig_names[] = { "&", "+", "-" };

                for (lp = ambig_ops ; *lp && *lp != t ; ++lp) ;
                if (*lp)
                {
                    errlog1(ctx->prscxerr, ERR_AMBIGBIN,
                            ERRTSTR, ambig_names[lp - ambig_ops]);
                    break;
                }
            }

            /* skip the operator */
            toknext(ctx->prscxtok);

            /* use C-style operators if in C mode */
            if (prs_cmode(ctx))
            {
                switch(t)
                {
                case TOKTEQEQ:
                    t = TOKTEQ;
                    break;

                case TOKTEQ:
                    t = TOKTASSIGN;
                    break;
                }
            }

            /* generate a node for the binary operator */
            n = prsnew2(ctx, t, n, (*binctx->prsbrf)(ctx, binctx->prsbctx));
        }
        else
            break;
    } while (binctx->prsbrpt);
    
    return(n);
}